

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int plot_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
              t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  _instancetemplate *p_Var1;
  t_gobj *ptVar2;
  t_scalar *x;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  _fielddesc *xfielddesc_00;
  _array *p_Var12;
  uint uVar13;
  char cVar14;
  long lVar15;
  char *pcVar16;
  _glist *p_Var17;
  float basey_00;
  t_float tVar18;
  t_float tVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  t_float pwpix;
  _array *local_158;
  char local_14d;
  float local_14c;
  double local_148;
  long local_140;
  _glist *local_138;
  long local_130;
  _array *local_128;
  float local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  t_symbol *local_100;
  _fielddesc *local_f8;
  double local_f0;
  _fielddesc *local_e8;
  t_float pypix;
  undefined4 uStack_dc;
  t_float pxpix;
  uint local_cc;
  int xonset;
  int wonset;
  int yonset;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  int elemsize;
  uint local_a0;
  int yonset_1;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  t_float style;
  t_float linewidth;
  int wonset_1;
  _glist *elemtemplatecanvas;
  
  local_14c = basex;
  local_138 = glist;
  local_128 = ap;
  local_118 = (t_template *)sc;
  iVar7 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,&yloc,
                     &style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if (iVar7 != 0) {
    return 0;
  }
  if ((vis == 0.0) && (!NAN(vis))) {
    return 0;
  }
  local_14c = local_14c + xloc;
  basey_00 = basey + yloc;
  local_140 = CONCAT44(local_140._4_4_,scalarvis);
  local_148 = (double)CONCAT44(local_148._4_4_,edit);
  iVar7 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                          yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
  p_Var17 = local_138;
  if (iVar7 != 0) {
    return 0;
  }
  local_f8 = wfielddesc;
  local_e8 = xfielddesc;
  local_158 = array;
  local_cc = 1;
  if (2000 < array->a_n) {
    local_cc = (uint)array->a_n / 1000;
  }
  local_130 = (long)elemsize;
  p_Var1 = (pd_maininstance.pd_gui)->i_template;
  *(int *)(p_Var1 + 0xa4) = elemsize;
  *(_glist **)(p_Var1 + 0x78) = local_138;
  *(t_template **)(p_Var1 + 0x80) = local_118;
  *(_array **)(p_Var1 + 0x88) = local_128;
  *(t_template **)(p_Var1 + 0x98) = elemtemplate;
  tVar18 = glist_dpixtodx(local_138,1.0);
  *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb0) = tVar18;
  tVar18 = glist_dpixtody(p_Var17,1.0);
  iVar8 = yonset;
  iVar7 = wonset;
  *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb4) = tVar18;
  ptVar2 = p_Var17->gl_list;
  if (((ptVar2 == (t_gobj *)0x0) || (ptVar2->g_pd != garray_class)) ||
     ((int)local_130 != 8 || ptVar2->g_next != (_gobj *)0x0)) {
    local_100 = elemtemplatesym;
    local_128 = (_array *)yfielddesc;
    if (local_158->a_n < 1) {
      local_118 = (t_template *)0x42c80000;
      uStack_110 = 0;
    }
    else {
      local_98 = (double)CONCAT44(local_98._4_4_,xonset);
      local_f0 = (double)CONCAT44(local_f0._4_4_,(float)xpix);
      local_11c = (float)ypix;
      uVar11 = (ulong)local_cc;
      lVar15 = local_130 * uVar11;
      local_118 = (t_template *)0x42c80000;
      uStack_110 = 0;
      lVar10 = 0;
      lVar9 = 0;
      do {
        array_getcoordinate(local_138,local_158->a_vec + lVar10,(int)local_98._0_4_,iVar8,iVar7,
                            (int)lVar9,local_14c,basey_00,xinc,local_e8,(_fielddesc *)local_128,
                            local_f8,&pxpix,&pypix,&pwpix);
        if (pwpix < 4.0) {
          pwpix = 4.0;
        }
        fVar20 = pxpix - local_f0._0_4_;
        fVar24 = -fVar20;
        if (-fVar20 <= fVar20) {
          fVar24 = fVar20;
        }
        if (fVar24 <= 8.0) {
          fVar21 = pypix - local_11c;
          fVar20 = -fVar21;
          if (-fVar21 <= fVar21) {
            fVar20 = fVar21;
          }
          fVar21 = fVar20 + fVar24;
          if ((float)local_118 <= fVar20 + fVar24) {
            fVar21 = (float)local_118;
          }
          if (iVar7 < 0) {
            local_118 = (t_template *)CONCAT44(0x80000000,fVar21);
            uStack_110 = 0x8000000080000000;
          }
          else {
            fVar22 = (pypix + pwpix) - local_11c;
            fVar20 = -fVar22;
            if (-fVar22 <= fVar22) {
              fVar20 = fVar22;
            }
            fVar22 = fVar20 + fVar24;
            if (fVar21 <= fVar20 + fVar24) {
              fVar22 = fVar21;
            }
            fVar21 = (pypix - pwpix) - local_11c;
            fVar20 = -fVar21;
            if (-fVar21 <= fVar21) {
              fVar20 = fVar21;
            }
            local_118 = (t_template *)CONCAT44(0x80000000,fVar22);
            uStack_110 = 0x8000000080000000;
            if (fVar20 + fVar24 < fVar22) {
              local_118 = (t_template *)CONCAT44(0x80000000,fVar20 + fVar24);
              uStack_110 = 0x8000000080000000;
            }
          }
        }
        lVar9 = lVar9 + uVar11;
        lVar10 = lVar10 + lVar15;
      } while (lVar9 < local_158->a_n);
    }
    if (8.0 < (float)local_118) {
      if (((float)local_140 != 0.0) || (NAN((float)local_140))) {
        iVar7 = 0;
        if ((local_100 != &s_float) &&
           ((iVar8 = array_getfields(local_100,(_glist **)&pxpix,(t_template **)&pypix,(int *)&pwpix
                                     ,local_e8,(_fielddesc *)local_128,local_f8,(int *)&local_a0,
                                     &yonset_1,&wonset_1), iVar8 == 0 &&
            (uVar13 = local_158->a_n, 0 < (int)uVar13)))) {
          local_f8 = (_fielddesc *)1;
          if (1999 < (int)uVar13) {
            local_f8 = (_fielddesc *)((ulong)uVar13 / 300);
          }
          local_98 = (double)local_14c;
          local_f0 = (double)xinc;
          local_118 = (t_template *)CONCAT44(uStack_dc,pypix);
          local_140 = (long)(int)pwpix * (long)local_f8;
          local_148 = 0.0;
          lVar9 = 0;
          lVar10 = 0;
          p_Var12 = local_158;
          do {
            if ((int)local_a0 < 0) {
              tVar18 = (t_float)(local_148 + local_98);
              local_148 = local_148 + local_f0;
            }
            else {
              tVar18 = fielddesc_cvttocoord
                                 (local_e8,*(t_float *)(p_Var12->a_vec + lVar9 + (ulong)local_a0));
              tVar18 = tVar18 + local_14c;
            }
            p_Var12 = local_158;
            if (yonset_1 < 0) {
              tVar19 = 0.0;
            }
            else {
              tVar19 = fielddesc_cvttocoord
                                 ((_fielddesc *)local_128,
                                  *(t_float *)(local_158->a_vec + lVar9 + (ulong)(uint)yonset_1));
            }
            iVar7 = scalar_doclick((t_word *)(p_Var12->a_vec + lVar9),local_118,(t_scalar *)0x0,
                                   p_Var12,local_138,tVar18,tVar19 + basey_00,xpix,ypix,shift,alt,
                                   dbl,doit);
            if (iVar7 != 0) goto LAB_0015bc2d;
            lVar10 = lVar10 + (long)local_f8;
            lVar9 = lVar9 + local_140;
          } while (lVar10 < p_Var12->a_n);
          goto LAB_0015bc2a;
        }
      }
      else {
LAB_0015bc2a:
        iVar7 = 0;
      }
LAB_0015bc2d:
      local_100._0_4_ = iVar7;
      bVar6 = false;
      goto LAB_0015bc3d;
    }
    if ((local_148._0_4_ == 0.0) && (!NAN(local_148._0_4_))) goto LAB_0015bc2a;
    yfielddesc = local_e8;
    if (0 < local_158->a_n) {
      local_80 = 1.0 / (double)xinc;
      if ((xinc == 0.0) && (!NAN(xinc))) {
        local_80 = 1.0;
      }
      local_98 = (double)CONCAT44((int)((ulong)((double)(float)local_118 + 0.001) >> 0x20),
                                  (float)((double)(float)local_118 + 0.001));
      uStack_90 = 0;
      local_148 = (double)CONCAT44(local_148._4_4_,xonset);
      local_118 = (t_template *)CONCAT44(local_118._4_4_,yonset);
      local_140 = CONCAT44(local_140._4_4_,(float)xpix);
      uVar13 = 0;
      local_11c = (float)wonset;
      local_f0 = (double)CONCAT44(local_f0._4_4_,(float)ypix);
      xfielddesc_00 = local_e8;
      p_Var17 = local_138;
      do {
        fVar24 = local_11c;
        iVar7 = uVar13 * (int)local_130;
        array_getcoordinate(p_Var17,local_158->a_vec + iVar7,(int)local_148._0_4_,
                            (int)(float)local_118,(int)local_11c,uVar13,local_14c,basey_00,xinc,
                            xfielddesc_00,(_fielddesc *)local_128,local_f8,&pxpix,&pypix,&pwpix);
        p_Var12 = local_158;
        if (pwpix < 4.0) {
          pwpix = 4.0;
        }
        fVar21 = pypix - local_f0._0_4_;
        fVar20 = -fVar21;
        if (-fVar21 <= fVar21) {
          fVar20 = fVar21;
        }
        if ((int)fVar24 < 0) {
          fVar24 = 100.0;
          fVar21 = 100.0;
        }
        else {
          fVar24 = (pypix + pwpix) - local_f0._0_4_;
          fVar21 = -fVar24;
          if (-fVar24 <= fVar24) {
            fVar21 = fVar24;
          }
          fVar22 = (pypix - pwpix) - local_f0._0_4_;
          fVar24 = -fVar22;
          if (-fVar22 <= fVar22) {
            fVar24 = fVar22;
          }
          if ((int)(float)local_118 < 0) {
            fVar20 = 100.0;
          }
        }
        fVar23 = pxpix - (float)local_140;
        fVar22 = -fVar23;
        if (-fVar23 <= fVar23) {
          fVar22 = fVar23;
        }
        bVar4 = local_98._0_4_ < fVar22 + fVar20;
        bVar5 = local_98._0_4_ < fVar22 + fVar21;
        bVar3 = local_98._0_4_ < fVar22 + fVar24;
        bVar6 = bVar3 && (bVar5 && bVar4);
        if (!bVar3 || (!bVar5 || !bVar4)) {
          if ((fVar21 <= fVar20) || (fVar24 <= fVar20)) {
            if (fVar24 <= fVar21) {
              *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 1;
            }
            else {
              *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0xffffffff;
            }
          }
          else {
            *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0;
          }
          if (doit != 0) {
            pcVar16 = local_158->a_vec;
            cVar14 = pxpix <= (float)local_140 || alt == 0;
            if ((float)local_140 < pxpix && alt != 0) {
              local_100 = (t_symbol *)((ulong)local_100 & 0xffffffff00000000);
              if (1 < local_158->a_n) {
                memmove(pcVar16 + iVar7,pcVar16 + (int)((uVar13 + 1) * (int)local_130),
                        (long)(int)((local_158->a_n + ~uVar13) * (int)local_130));
                array_resize_and_redraw(local_158,local_138,local_158->a_n + -1);
              }
            }
            else {
              local_14d = cVar14;
              if (alt != 0) {
                array_resize_and_redraw(local_158,local_138,local_158->a_n + 1);
                xfielddesc_00 = local_e8;
                pcVar16 = p_Var12->a_vec;
                memmove(pcVar16 + (int)((uVar13 + 1) * (int)local_130),pcVar16 + iVar7,
                        (long)(int)((~uVar13 + p_Var12->a_n) * (int)local_130));
                uVar13 = uVar13 + 1;
              }
              p_Var1 = (pd_maininstance.pd_gui)->i_template;
              if ((int)local_148._0_4_ < 0) {
                *(undefined8 *)(p_Var1 + 0x68) = 0;
                *(undefined4 *)(p_Var1 + 0x60) = 0;
                *(char **)(p_Var1 + 0x90) = pcVar16;
                *(int *)(p_Var1 + 0xa0) = local_158->a_n;
                *(float *)(p_Var1 + 0xac) = (float)(int)uVar13;
                *(uint *)(p_Var1 + 0xb8) = uVar13;
                *(float *)(p_Var1 + 0xb0) = (float)((double)*(float *)(p_Var1 + 0xb0) * local_80);
              }
              else {
                *(_fielddesc **)(p_Var1 + 0x68) = xfielddesc_00;
                iVar7 = uVar13 * (int)local_130;
                tVar18 = fielddesc_getcoord(xfielddesc_00,*(t_template **)(p_Var1 + 0x98),
                                            (t_word *)(pcVar16 + iVar7),1);
                p_Var1 = (pd_maininstance.pd_gui)->i_template;
                *(t_float *)(p_Var1 + 0x60) = tVar18;
                *(t_word **)(p_Var1 + 0x90) = (t_word *)(pcVar16 + iVar7);
                if (shift == 0) {
                  *(undefined4 *)(p_Var1 + 0xa0) = 1;
                }
                else {
                  *(uint *)(p_Var1 + 0xa0) = local_158->a_n - uVar13;
                }
              }
              p_Var1 = (pd_maininstance.pd_gui)->i_template;
              if (*(int *)(p_Var1 + 0xbc) == 0) {
                if ((int)(float)local_118 < 0) {
                  *(undefined8 *)(p_Var1 + 0x70) = 0;
                  *(undefined4 *)(p_Var1 + 100) = 0;
                }
                else {
                  *(_array **)(p_Var1 + 0x70) = local_128;
                  tVar18 = fielddesc_getcoord((_fielddesc *)local_128,
                                              *(t_template **)(p_Var1 + 0x98),
                                              (t_word *)(pcVar16 + (int)(uVar13 * (int)local_130)),1
                                             );
                  *(t_float *)((pd_maininstance.pd_gui)->i_template + 100) = tVar18;
                }
              }
              else {
                *(_fielddesc **)(p_Var1 + 0x70) = local_f8;
                tVar18 = fielddesc_getcoord(local_f8,*(t_template **)(p_Var1 + 0x98),
                                            (t_word *)(pcVar16 + (int)(uVar13 * (int)local_130)),1);
                p_Var1 = (pd_maininstance.pd_gui)->i_template;
                *(t_float *)(p_Var1 + 100) = tVar18;
                if (*(float *)(p_Var1 + 0xb4) < 0.0) {
                  *(float *)(p_Var1 + 0xb4) = -*(float *)(p_Var1 + 0xb4);
                }
                *(float *)(p_Var1 + 0xb4) =
                     (float)-*(int *)(p_Var1 + 0xbc) * *(float *)(p_Var1 + 0xb4);
              }
              glist_grab(local_138,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
              cVar14 = local_14d;
            }
            p_Var17 = local_138;
            if (cVar14 == '\0') goto LAB_0015bc09;
          }
          if (alt == 0) {
            iVar7 = 2 - (uint)(*(int *)((pd_maininstance.pd_gui)->i_template + 0xbc) == 0);
          }
          else {
            iVar7 = (uint)((float)local_140 < pxpix) * 3 + 3;
          }
          local_100 = (t_symbol *)CONCAT44(local_100._4_4_,iVar7);
        }
LAB_0015bc09:
        if (!bVar3 || (!bVar5 || !bVar4)) goto LAB_0015bc3d;
        uVar13 = uVar13 + local_cc;
      } while ((int)uVar13 < local_158->a_n);
      yfielddesc = (_fielddesc *)((ulong)local_100 & 0xffffffff);
      goto LAB_0015bc3a;
    }
  }
  else {
    tVar18 = glist_pixelstox(p_Var17,(float)xpix);
    p_Var12 = local_158;
    iVar8 = (int)tVar18;
    iVar7 = 0;
    if ((-1 < iVar8) && (iVar7 = local_158->a_n + -1, iVar8 < local_158->a_n)) {
      iVar7 = iVar8;
    }
    *(_fielddesc **)((pd_maininstance.pd_gui)->i_template + 0x70) = yfielddesc;
    tVar18 = glist_pixelstoy(p_Var17,(float)ypix);
    p_Var1 = (pd_maininstance.pd_gui)->i_template;
    *(t_float *)(p_Var1 + 100) = tVar18;
    *(undefined4 *)(p_Var1 + 0xbc) = 0;
    *(undefined8 *)(p_Var1 + 0x68) = 0;
    *(undefined4 *)(p_Var1 + 0x60) = 0;
    *(float *)(p_Var1 + 0xac) = (float)iVar7;
    *(int *)(p_Var1 + 0xb8) = (int)(float)iVar7;
    *(int *)(p_Var1 + 0xa0) = p_Var12->a_n;
    pcVar16 = p_Var12->a_vec;
    *(char **)(p_Var1 + 0x90) = pcVar16;
    if (doit == 0) {
LAB_0015bc3a:
      local_100._0_4_ = (int)yfielddesc;
      bVar6 = true;
      goto LAB_0015bc3d;
    }
    iVar7 = iVar7 * (int)local_130;
    tVar18 = glist_pixelstoy(p_Var17,(float)ypix);
    fielddesc_setcoord(yfielddesc,elemtemplate,(t_word *)(pcVar16 + iVar7),tVar18,1);
    glist_grab(p_Var17,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
    x = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0x80);
    if (x != (t_scalar *)0x0) {
      scalar_redraw(x,*(_glist **)((pd_maininstance.pd_gui)->i_template + 0x78));
    }
    p_Var12 = *(_array **)((pd_maininstance.pd_gui)->i_template + 0x88);
    if (p_Var12 != (_array *)0x0) {
      array_redraw(p_Var12,*(_glist **)((pd_maininstance.pd_gui)->i_template + 0x78));
    }
  }
  local_100._0_4_ = (int)yfielddesc;
  bVar6 = true;
LAB_0015bc3d:
  if (bVar6) {
    return 0;
  }
  return (int)local_100;
}

Assistant:

static int plot_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_plot *x = (t_plot *)z;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, vis, scalarvis, edit;
    t_array *array;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;

    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit,
        &xfielddesc, &yfielddesc, &wfielddesc) && (vis != 0))
    {
        return (array_doclick(array, glist, sc, ap, elemtemplatesym,
            basex + xloc, xinc, basey + yloc, scalarvis, edit,
            xfielddesc, yfielddesc, wfielddesc,
            xpix, ypix, shift, alt, dbl, doit));
    }
    else return (0);
}